

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aflatin.c
# Opt level: O1

FT_Error af_latin_hints_compute_segments(AF_GlyphHints hints,AF_Dimension dim)

{
  char cVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  FT_Char FVar9;
  FT_Short FVar10;
  FT_Short FVar11;
  FT_Short FVar12;
  AF_Segment_conflict pAVar13;
  AF_Segment_conflict pAVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  AF_Direction AVar18;
  AF_Direction AVar19;
  long lVar20;
  long lVar21;
  AF_Direction AVar22;
  int iVar23;
  ulong uVar24;
  byte bVar25;
  byte bVar26;
  AF_Point_conflict point;
  AF_Point_conflict pAVar27;
  AF_Point_conflict limit;
  short sVar28;
  long lVar29;
  long lVar30;
  AF_Point_conflict pAVar31;
  short sVar32;
  bool bVar33;
  byte bVar34;
  uint local_134;
  uint local_130;
  FT_Error local_12c;
  AF_Segment_conflict local_128;
  long local_120;
  long local_118;
  AF_AxisHintsRec *local_110;
  uint local_104;
  uint local_100;
  AF_Direction local_fc;
  long local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  AF_Segment_conflict local_d0;
  ulong local_c8;
  long local_c0;
  long local_b8;
  uint local_ac;
  FT_Memory local_a8;
  AF_Point_conflict *local_a0;
  AF_Point_conflict *local_98;
  AF_Point_conflict local_90;
  FT_Pos local_88;
  AF_Point_conflict pAStack_80;
  AF_Point_conflict local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined7 uStack_50;
  undefined1 local_49;
  undefined7 uStack_48;
  AF_Segment pAStack_41;
  
  bVar34 = 0;
  local_a8 = hints->memory;
  local_a0 = hints->contours;
  iVar23 = hints->num_contours;
  uVar3 = *(uint *)&hints->metrics[1].style_class;
  uStack_48 = 0;
  pAStack_41 = (AF_Segment)0x0;
  uStack_58 = 0;
  uStack_50 = 0;
  local_49 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_88 = 0;
  pAStack_80 = (AF_Point_conflict)0x0;
  local_78 = (AF_Point_conflict)0x0;
  AVar19 = hints->axis[dim].major_dir;
  local_fc = -AVar19;
  if (~AF_DIR_LEFT < AVar19) {
    local_fc = AVar19;
  }
  hints->axis[dim].num_segments = 0;
  pAVar27 = hints->points;
  iVar4 = hints->num_points;
  pAVar31 = pAVar27 + iVar4;
  if (dim == AF_DIMENSION_HORZ) {
    if (0 < iVar4) {
      do {
        pAVar27->u = (long)pAVar27->fx;
        pAVar27->v = (long)pAVar27->fy;
        pAVar27 = pAVar27 + 1;
      } while (pAVar27 < pAVar31);
    }
  }
  else if (0 < iVar4) {
    do {
      pAVar27->u = (long)pAVar27->fy;
      pAVar27->v = (long)pAVar27->fx;
      pAVar27 = pAVar27 + 1;
    } while (pAVar27 < pAVar31);
  }
  local_110 = hints->axis + dim;
  if (iVar23 < 1) {
    local_12c = 0;
  }
  else {
    local_98 = local_a0 + iVar23;
    local_c8 = (ulong)(uVar3 >> 1) / 7;
    local_d0 = hints->axis[dim].embedded.segments;
    local_12c = 0;
    pAVar13 = (AF_Segment_conflict)0x0;
    AVar19 = local_fc;
    do {
      pAVar27 = *local_a0;
      bVar26 = pAVar27->prev->out_dir;
      bVar25 = (char)bVar26 >> 7;
      pAVar31 = pAVar27;
      if ((local_fc == (uint)(byte)((bVar26 ^ bVar25) - bVar25)) &&
         (bVar26 = pAVar27->out_dir >> 7,
         local_fc == (uint)(byte)((pAVar27->out_dir ^ bVar26) - bVar26))) {
        do {
          pAVar31 = pAVar31->prev;
          bVar26 = pAVar31->out_dir >> 7;
          if (local_fc != (uint)(byte)((pAVar31->out_dir ^ bVar26) - bVar26)) {
            pAVar31 = pAVar31->next;
            break;
          }
        } while (pAVar31 != pAVar27);
      }
      local_120 = -32000;
      lVar20 = 32000;
      bVar6 = false;
      local_e8 = 32000;
      local_118 = -32000;
      local_130 = 0;
      local_134 = 0;
      lVar30 = 32000;
      lVar29 = -32000;
      bVar7 = false;
      local_128 = (AF_Segment_conflict)0x0;
      local_f8 = 32000;
      local_f0 = -32000;
      local_d8 = 32000;
      local_e0 = -32000;
      local_100 = 0;
      local_104 = 0;
      local_b8 = 32000;
      local_c0 = -32000;
      pAVar14 = pAVar13;
      local_90 = pAVar31;
      do {
        bVar33 = true;
        pAVar13 = pAVar14;
        if (bVar6) {
          lVar17 = pAVar31->u;
          lVar21 = pAVar31->v;
          if (lVar17 < lVar20) {
            lVar20 = lVar17;
          }
          if (local_120 < lVar17) {
            local_120 = lVar17;
          }
          if (lVar21 < local_e8) {
            local_130 = (uint)pAVar31->flags;
            local_e8 = lVar21;
          }
          if (local_118 < lVar21) {
            local_134 = (uint)pAVar31->flags;
            local_118 = lVar21;
          }
          lVar17 = lVar30;
          if (lVar21 < lVar30) {
            lVar17 = lVar21;
          }
          if (lVar21 <= lVar29) {
            lVar21 = lVar29;
          }
          if ((pAVar31->flags & 3) != 0) {
            lVar21 = lVar29;
            lVar17 = lVar30;
          }
          lVar30 = lVar17;
          lVar29 = lVar21;
          if ((AVar19 == pAVar31->out_dir) && (pAVar31 != local_90)) {
            bVar33 = false;
            bVar6 = true;
          }
          else {
            sVar32 = (short)local_e8;
            sVar28 = (short)local_118;
            if ((local_128 == (AF_Segment_conflict)0x0) || (pAVar14->first != local_128->last)) {
              pAVar14->last = pAVar31;
              pAVar14->pos = (FT_Short)((uint)((int)lVar20 + (int)local_120) >> 1);
              pAVar14->delta = (FT_Short)((uint)((int)local_120 - (int)lVar20) >> 1);
              if ((((local_134 | local_130) & 3) != 0) && (lVar29 - lVar30 < (long)local_c8)) {
                pAVar14->flags = pAVar14->flags | 1;
              }
              pAVar14->min_coord = sVar32;
              pAVar14->max_coord = sVar28;
              pAVar14->height = sVar28 - sVar32;
              bVar6 = false;
              local_e0 = local_118;
              local_100 = local_130;
              local_104 = local_134;
              pAVar13 = (AF_Segment_conflict)0x0;
              local_128 = pAVar14;
              local_f8 = lVar20;
              local_f0 = local_120;
              local_d8 = local_e8;
              local_c0 = lVar29;
              local_b8 = lVar30;
            }
            else {
              if (local_128->last->in_dir == pAVar31->in_dir) {
                if (local_f8 < lVar20) {
                  lVar20 = local_f8;
                }
                if (local_120 < local_f0) {
                  local_120 = local_f0;
                }
                if (local_d8 < local_e8) {
                  local_130 = local_100;
                  local_e8 = local_d8;
                }
                if (local_118 < local_e0) {
                  local_134 = local_104;
                  local_118 = local_e0;
                }
                if (local_b8 < lVar30) {
                  lVar30 = local_b8;
                }
                if (lVar29 < local_c0) {
                  lVar29 = local_c0;
                }
                local_128->last = pAVar31;
                local_128->pos = (FT_Short)((uint)((int)lVar20 + (int)local_120) >> 1);
                local_128->delta = (FT_Short)((uint)((int)local_120 - (int)lVar20) >> 1);
                local_128->flags =
                     local_128->flags & 0xfe |
                     (lVar29 - lVar30 < (long)local_c8 && ((local_134 | local_130) & 3) != 0);
                local_128->min_coord = (short)local_e8;
                local_128->max_coord = (short)local_118;
                local_128->height = (short)local_118 - (short)local_e8;
              }
              else {
                uVar15 = local_e0 - local_d8;
                uVar24 = -uVar15;
                if (0 < (long)uVar15) {
                  uVar24 = uVar15;
                }
                uVar16 = local_118 - local_e8;
                uVar15 = -uVar16;
                if (0 < (long)uVar16) {
                  uVar15 = uVar16;
                }
                if (uVar15 < uVar24) {
                  if (lVar20 < local_f8) {
                    local_f8 = lVar20;
                  }
                  if (local_f0 < local_120) {
                    local_f0 = local_120;
                  }
                  local_128->last = pAVar31;
                  local_128->pos = (FT_Short)((uint)((int)local_f8 + (int)local_f0) >> 1);
                  local_128->delta = (FT_Short)((uint)((int)local_f0 - (int)local_f8) >> 1);
                }
                else {
                  if (local_f8 < lVar20) {
                    lVar20 = local_f8;
                  }
                  if (local_120 < local_f0) {
                    local_120 = local_f0;
                  }
                  pAVar14->last = pAVar31;
                  pAVar14->pos = (FT_Short)((uint)((int)lVar20 + (int)local_120) >> 1);
                  pAVar14->delta = (FT_Short)((uint)((int)local_120 - (int)lVar20) >> 1);
                  if ((((local_134 | local_130) & 3) != 0) && (lVar29 - lVar30 < (long)local_c8)) {
                    pAVar14->flags = pAVar14->flags | 1;
                  }
                  pAVar14->min_coord = sVar32;
                  pAVar14->max_coord = sVar28;
                  pAVar14->height = sVar28 - sVar32;
                  pAVar13 = local_128;
                  for (lVar17 = 10; lVar17 != 0; lVar17 = lVar17 + -1) {
                    FVar9 = pAVar14->dir;
                    FVar10 = pAVar14->pos;
                    FVar11 = pAVar14->delta;
                    FVar12 = pAVar14->min_coord;
                    pAVar13->flags = pAVar14->flags;
                    pAVar13->dir = FVar9;
                    pAVar13->pos = FVar10;
                    pAVar13->delta = FVar11;
                    pAVar13->min_coord = FVar12;
                    pAVar14 = (AF_Segment_conflict)((long)pAVar14 + (ulong)bVar34 * -0x10 + 8);
                    pAVar13 = (AF_Segment_conflict)((long)pAVar13 + (ulong)bVar34 * -0x10 + 8);
                  }
                  local_e0 = local_118;
                  local_100 = local_130;
                  local_104 = local_134;
                  local_f8 = lVar20;
                  local_f0 = local_120;
                  local_d8 = local_e8;
                  local_c0 = lVar29;
                  local_b8 = lVar30;
                }
              }
              local_110->num_segments = local_110->num_segments - 1;
              bVar6 = false;
              pAVar13 = (AF_Segment_conflict)0x0;
            }
          }
        }
        else {
          bVar6 = false;
        }
        if (pAVar31 == local_90) {
          iVar23 = 0xd;
          bVar8 = !bVar7;
          bVar7 = true;
          if (bVar8) goto LAB_0026e5de;
        }
        else {
LAB_0026e5de:
          bVar6 = true;
          if (bVar33) {
            cVar1 = pAVar31->out_dir;
            AVar18 = (AF_Direction)cVar1;
            AVar22 = -AVar18;
            if (~AF_DIR_LEFT < AVar18) {
              AVar22 = AVar18;
            }
            if ((AVar22 == local_fc) || (pAVar31 == pAVar31->prev)) {
              uVar3 = local_110->num_segments;
              if (1000 < uVar3) {
                local_110->num_segments = 0;
                iVar23 = 1;
                bVar6 = false;
                goto LAB_0026e63f;
              }
              local_12c = 0;
              if (uVar3 < 0x12) {
                if (local_110->segments == (AF_Segment_conflict)0x0) {
                  local_110->segments = local_d0;
                  local_110->max_segments = 0x12;
                }
LAB_0026e6b3:
                uVar3 = local_110->num_segments;
                local_110->num_segments = uVar3 + 1;
                pAVar13 = local_110->segments + uVar3;
              }
              else {
                uVar5 = local_110->max_segments;
                if (uVar3 < uVar5) goto LAB_0026e6b3;
                if (uVar5 < 0x1999999) {
                  local_ac = uVar5 + (uVar5 >> 2) + 4;
                  if (0x1999998 < local_ac) {
                    local_ac = 0x1999999;
                  }
                  if (local_110->segments == local_d0) {
                    pAVar14 = (AF_Segment_conflict)
                              ft_mem_realloc(local_a8,0x50,0,(ulong)local_ac,(void *)0x0,&local_12c)
                    ;
                    local_110->segments = pAVar14;
                    pAVar13 = (AF_Segment_conflict)0x0;
                    if (local_12c == 0) {
                      memcpy(pAVar14,local_d0,0x5a0);
                      goto LAB_0026e8b8;
                    }
                  }
                  else {
                    pAVar13 = (AF_Segment_conflict)
                              ft_mem_realloc(local_a8,0x50,(ulong)uVar5,(ulong)local_ac,
                                             local_110->segments,&local_12c);
                    local_110->segments = pAVar13;
                    if (local_12c == 0) {
LAB_0026e8b8:
                      local_110->max_segments = local_ac;
                      goto LAB_0026e6b3;
                    }
                    pAVar13 = (AF_Segment_conflict)0x0;
                  }
                }
                else {
                  local_12c = 0x40;
                  pAVar13 = (AF_Segment_conflict)0x0;
                }
              }
              AVar19 = AVar18;
              if (local_12c != 0) {
                iVar23 = 0x13;
                bVar6 = false;
                goto LAB_0026e63f;
              }
              pAVar13->flags = '\0';
              *(undefined8 *)&pAVar13->dir = local_68;
              *(undefined8 *)((long)&pAVar13->max_coord + 1) = uStack_60;
              *(undefined8 *)((long)&pAVar13->edge + 1) = uStack_58;
              *(ulong *)((long)&pAVar13->edge_next + 1) = CONCAT17(local_49,uStack_50);
              pAVar13->link = (AF_Segment)CONCAT71(uStack_48,local_49);
              pAVar13->serif = pAStack_41;
              pAVar13->score = 32000;
              pAVar13->len = local_88;
              pAVar13->first = pAStack_80;
              pAVar13->last = local_78;
              pAVar13->dir = cVar1;
              pAVar13->first = pAVar31;
              pAVar13->last = pAVar31;
              pAVar14 = pAVar13 + -1;
              if (local_128 == (AF_Segment_conflict)0x0) {
                pAVar14 = local_128;
              }
              lVar20 = pAVar31->u;
              local_118 = pAVar31->v;
              uVar2 = pAVar31->flags;
              bVar33 = (uVar2 & 3) == 0;
              lVar30 = 32000;
              if (bVar33) {
                lVar30 = local_118;
              }
              lVar29 = -32000;
              if (bVar33) {
                lVar29 = local_118;
              }
              local_134 = (uint)uVar2;
              local_120 = lVar20;
              local_128 = pAVar14;
              local_e8 = local_118;
              local_130 = local_134;
              if (pAVar31 == pAVar31->prev) {
                pAVar13->pos = (FT_Short)lVar20;
                if ((uVar2 & 3) != 0) {
                  pAVar13->flags = '\x01';
                }
                pAVar13->min_coord = (FT_Short)local_118;
                pAVar13->max_coord = (FT_Short)local_118;
                pAVar13->height = 0;
                pAVar13 = (AF_Segment_conflict)0x0;
                bVar6 = false;
                local_12c = 0;
              }
              else {
                local_12c = 0;
              }
            }
            else {
              bVar6 = false;
            }
          }
          pAVar31 = pAVar31->next;
          iVar23 = 0;
        }
LAB_0026e63f:
        pAVar14 = pAVar13;
      } while (iVar23 == 0);
      if (iVar23 == 0xd) {
        iVar23 = 0;
      }
      if (iVar23 != 0) {
        if (iVar23 == 0x13) {
          return local_12c;
        }
        return 0;
      }
      local_a0 = local_a0 + 1;
    } while (local_a0 < local_98);
  }
  pAVar13 = local_110->segments;
  if (pAVar13 == (AF_Segment_conflict)0x0) {
    pAVar14 = (AF_Segment_conflict)0x0;
  }
  else {
    pAVar14 = pAVar13 + local_110->num_segments;
  }
  do {
    if (pAVar14 <= pAVar13) {
      return local_12c;
    }
    pAVar27 = pAVar13->last;
    lVar20 = pAVar13->first->v;
    lVar30 = pAVar27->v;
    lVar29 = pAVar13->first->prev->v;
    if (lVar20 < lVar30) {
      if (lVar29 < lVar20) {
        pAVar13->height = pAVar13->height + (short)((uint)((int)lVar20 - (int)lVar29) >> 1);
      }
      lVar20 = pAVar27->next->v;
      uVar24 = lVar20 - lVar30;
      if (uVar24 != 0 && lVar30 <= lVar20) {
LAB_0026e9af:
        pAVar13->height = pAVar13->height + (short)(uVar24 >> 1);
      }
    }
    else {
      if (lVar20 < lVar29) {
        pAVar13->height = pAVar13->height + (short)((uint)((int)lVar29 - (int)lVar20) >> 1);
      }
      lVar20 = pAVar27->next->v;
      uVar24 = lVar30 - lVar20;
      if (uVar24 != 0 && lVar20 <= lVar30) goto LAB_0026e9af;
    }
    pAVar13 = pAVar13 + 1;
  } while( true );
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  af_latin_hints_compute_segments( AF_GlyphHints  hints,
                                   AF_Dimension   dim )
  {
    AF_LatinMetrics  metrics       = (AF_LatinMetrics)hints->metrics;
    AF_AxisHints     axis          = &hints->axis[dim];
    FT_Memory        memory        = hints->memory;
    FT_Error         error         = FT_Err_Ok;
    AF_Segment       segment       = NULL;
    AF_SegmentRec    seg0;
    AF_Point*        contour       = hints->contours;
    AF_Point*        contour_limit = contour + hints->num_contours;
    AF_Direction     major_dir, segment_dir;

    FT_Pos  flat_threshold = FLAT_THRESHOLD( metrics->units_per_em );


    FT_ZERO( &seg0 );
    seg0.score = 32000;
    seg0.flags = AF_EDGE_NORMAL;

    major_dir   = (AF_Direction)FT_ABS( axis->major_dir );
    segment_dir = major_dir;

    axis->num_segments = 0;

    /* set up (u,v) in each point */
    if ( dim == AF_DIMENSION_HORZ )
    {
      AF_Point  point = hints->points;
      AF_Point  limit = point + hints->num_points;


      for ( ; point < limit; point++ )
      {
        point->u = point->fx;
        point->v = point->fy;
      }
    }
    else
    {
      AF_Point  point = hints->points;
      AF_Point  limit = point + hints->num_points;


      for ( ; point < limit; point++ )
      {
        point->u = point->fy;
        point->v = point->fx;
      }
    }

    /* do each contour separately */
    for ( ; contour < contour_limit; contour++ )
    {
      AF_Point  point   = contour[0];
      AF_Point  last    = point->prev;
      int       on_edge = 0;

      /* we call values measured along a segment (point->v)    */
      /* `coordinates', and values orthogonal to it (point->u) */
      /* `positions'                                           */
      FT_Pos     min_pos      =  32000;
      FT_Pos     max_pos      = -32000;
      FT_Pos     min_coord    =  32000;
      FT_Pos     max_coord    = -32000;
      FT_UShort  min_flags    =  AF_FLAG_NONE;
      FT_UShort  max_flags    =  AF_FLAG_NONE;
      FT_Pos     min_on_coord =  32000;
      FT_Pos     max_on_coord = -32000;

      FT_Bool  passed;

      AF_Segment  prev_segment = NULL;

      FT_Pos     prev_min_pos      = min_pos;
      FT_Pos     prev_max_pos      = max_pos;
      FT_Pos     prev_min_coord    = min_coord;
      FT_Pos     prev_max_coord    = max_coord;
      FT_UShort  prev_min_flags    = min_flags;
      FT_UShort  prev_max_flags    = max_flags;
      FT_Pos     prev_min_on_coord = min_on_coord;
      FT_Pos     prev_max_on_coord = max_on_coord;


      if ( FT_ABS( last->out_dir )  == major_dir &&
           FT_ABS( point->out_dir ) == major_dir )
      {
        /* we are already on an edge, try to locate its start */
        last = point;

        for (;;)
        {
          point = point->prev;
          if ( FT_ABS( point->out_dir ) != major_dir )
          {
            point = point->next;
            break;
          }
          if ( point == last )
            break;
        }
      }

      last   = point;
      passed = 0;

      for (;;)
      {
        FT_Pos  u, v;


        if ( on_edge )
        {
          /* get minimum and maximum position */
          u = point->u;
          if ( u < min_pos )
            min_pos = u;
          if ( u > max_pos )
            max_pos = u;

          /* get minimum and maximum coordinate together with flags */
          v = point->v;
          if ( v < min_coord )
          {
            min_coord = v;
            min_flags = point->flags;
          }
          if ( v > max_coord )
          {
            max_coord = v;
            max_flags = point->flags;
          }

          /* get minimum and maximum coordinate of `on' points */
          if ( !( point->flags & AF_FLAG_CONTROL ) )
          {
            v = point->v;
            if ( v < min_on_coord )
              min_on_coord = v;
            if ( v > max_on_coord )
              max_on_coord = v;
          }

          if ( point->out_dir != segment_dir || point == last )
          {
            /* check whether the new segment's start point is identical to */
            /* the previous segment's end point; for example, this might   */
            /* happen for spikes                                           */

            if ( !prev_segment || segment->first != prev_segment->last )
            {
              /* points are different: we are just leaving an edge, thus */
              /* record a new segment                                    */

              segment->last  = point;
              segment->pos   = (FT_Short)( ( min_pos + max_pos ) >> 1 );
              segment->delta = (FT_Short)( ( max_pos - min_pos ) >> 1 );

              /* a segment is round if either its first or last point */
              /* is a control point, and the length of the on points  */
              /* inbetween doesn't exceed a heuristic limit           */
              if ( ( min_flags | max_flags ) & AF_FLAG_CONTROL      &&
                   ( max_on_coord - min_on_coord ) < flat_threshold )
                segment->flags |= AF_EDGE_ROUND;

              segment->min_coord = (FT_Short)min_coord;
              segment->max_coord = (FT_Short)max_coord;
              segment->height    = segment->max_coord - segment->min_coord;

              prev_segment      = segment;
              prev_min_pos      = min_pos;
              prev_max_pos      = max_pos;
              prev_min_coord    = min_coord;
              prev_max_coord    = max_coord;
              prev_min_flags    = min_flags;
              prev_max_flags    = max_flags;
              prev_min_on_coord = min_on_coord;
              prev_max_on_coord = max_on_coord;
            }
            else
            {
              /* points are the same: we don't create a new segment but */
              /* merge the current segment with the previous one        */

              if ( prev_segment->last->in_dir == point->in_dir )
              {
                /* we have identical directions (this can happen for       */
                /* degenerate outlines that move zig-zag along the main    */
                /* axis without changing the coordinate value of the other */
                /* axis, and where the segments have just been merged):    */
                /* unify segments                                          */

                /* update constraints */

                if ( prev_min_pos < min_pos )
                  min_pos = prev_min_pos;
                if ( prev_max_pos > max_pos )
                  max_pos = prev_max_pos;

                if ( prev_min_coord < min_coord )
                {
                  min_coord = prev_min_coord;
                  min_flags = prev_min_flags;
                }
                if ( prev_max_coord > max_coord )
                {
                  max_coord = prev_max_coord;
                  max_flags = prev_max_flags;
                }

                if ( prev_min_on_coord < min_on_coord )
                  min_on_coord = prev_min_on_coord;
                if ( prev_max_on_coord > max_on_coord )
                  max_on_coord = prev_max_on_coord;

                prev_segment->last  = point;
                prev_segment->pos   = (FT_Short)( ( min_pos +
                                                    max_pos ) >> 1 );
                prev_segment->delta = (FT_Short)( ( max_pos -
                                                    min_pos ) >> 1 );

                if ( ( min_flags | max_flags ) & AF_FLAG_CONTROL      &&
                     ( max_on_coord - min_on_coord ) < flat_threshold )
                  prev_segment->flags |= AF_EDGE_ROUND;
                else
                  prev_segment->flags &= ~AF_EDGE_ROUND;

                prev_segment->min_coord = (FT_Short)min_coord;
                prev_segment->max_coord = (FT_Short)max_coord;
                prev_segment->height    = prev_segment->max_coord -
                                          prev_segment->min_coord;
              }
              else
              {
                /* we have different directions; use the properties of the */
                /* longer segment and discard the other one                */

                if ( FT_ABS( prev_max_coord - prev_min_coord ) >
                     FT_ABS( max_coord - min_coord ) )
                {
                  /* discard current segment */

                  if ( min_pos < prev_min_pos )
                    prev_min_pos = min_pos;
                  if ( max_pos > prev_max_pos )
                    prev_max_pos = max_pos;

                  prev_segment->last  = point;
                  prev_segment->pos   = (FT_Short)( ( prev_min_pos +
                                                      prev_max_pos ) >> 1 );
                  prev_segment->delta = (FT_Short)( ( prev_max_pos -
                                                      prev_min_pos ) >> 1 );
                }
                else
                {
                  /* discard previous segment */

                  if ( prev_min_pos < min_pos )
                    min_pos = prev_min_pos;
                  if ( prev_max_pos > max_pos )
                    max_pos = prev_max_pos;

                  segment->last  = point;
                  segment->pos   = (FT_Short)( ( min_pos + max_pos ) >> 1 );
                  segment->delta = (FT_Short)( ( max_pos - min_pos ) >> 1 );

                  if ( ( min_flags | max_flags ) & AF_FLAG_CONTROL      &&
                       ( max_on_coord - min_on_coord ) < flat_threshold )
                    segment->flags |= AF_EDGE_ROUND;

                  segment->min_coord = (FT_Short)min_coord;
                  segment->max_coord = (FT_Short)max_coord;
                  segment->height    = segment->max_coord -
                                       segment->min_coord;

                  *prev_segment = *segment;

                  prev_min_pos      = min_pos;
                  prev_max_pos      = max_pos;
                  prev_min_coord    = min_coord;
                  prev_max_coord    = max_coord;
                  prev_min_flags    = min_flags;
                  prev_max_flags    = max_flags;
                  prev_min_on_coord = min_on_coord;
                  prev_max_on_coord = max_on_coord;
                }
              }

              axis->num_segments--;
            }

            on_edge = 0;
            segment = NULL;

            /* fall through */
          }
        }

        /* now exit if we are at the start/end point */
        if ( point == last )
        {
          if ( passed )
            break;
          passed = 1;
        }

        /* if we are not on an edge, check whether the major direction */
        /* coincides with the current point's `out' direction, or      */
        /* whether we have a single-point contour                      */
        if ( !on_edge                                  &&
             ( FT_ABS( point->out_dir ) == major_dir ||
               point == point->prev                  ) )
        {
          /*
           * For efficiency, we restrict the number of segments to 1000,
           * which is a heuristic value: it is very unlikely that a glyph
           * with so many segments can be hinted in a sensible way.
           * Reasons:
           *
           * - The glyph has really 1000 segments; this implies that it has
           *   at least 2000 outline points.  Assuming 'normal' fonts that
           *   have superfluous points optimized away, viewing such a glyph
           *   only makes sense at large magnifications where hinting
           *   isn't applied anyway.
           *
           * - We have a broken glyph.  Hinting doesn't make sense in this
           *   case either.
           */
          if ( axis->num_segments > 1000 )
          {
            FT_TRACE0(( "af_latin_hints_compute_segments:"
                        " more than 1000 segments in this glyph;\n" ));
            FT_TRACE0(( "                                "
                        " hinting is suppressed\n" ));
            axis->num_segments = 0;
            return FT_Err_Ok;
          }

          /* this is the start of a new segment! */
          segment_dir = (AF_Direction)point->out_dir;

          error = af_axis_hints_new_segment( axis, memory, &segment );
          if ( error )
            goto Exit;

          /* clear all segment fields */
          segment[0] = seg0;

          segment->dir   = (FT_Char)segment_dir;
          segment->first = point;
          segment->last  = point;

          /* `af_axis_hints_new_segment' reallocates memory,    */
          /* thus we have to refresh the `prev_segment' pointer */
          if ( prev_segment )
            prev_segment = segment - 1;

          min_pos   = max_pos   = point->u;
          min_coord = max_coord = point->v;
          min_flags = max_flags = point->flags;

          if ( point->flags & AF_FLAG_CONTROL )
          {
            min_on_coord =  32000;
            max_on_coord = -32000;
          }
          else
            min_on_coord = max_on_coord = point->v;

          on_edge = 1;

          if ( point == point->prev )
          {
            /* we have a one-point segment: this is a one-point */
            /* contour with `in' and `out' direction set to     */
            /* AF_DIR_NONE                                      */
            segment->pos = (FT_Short)min_pos;

            if (point->flags & AF_FLAG_CONTROL)
              segment->flags |= AF_EDGE_ROUND;

            segment->min_coord = (FT_Short)point->v;
            segment->max_coord = (FT_Short)point->v;
            segment->height = 0;

            on_edge = 0;
            segment = NULL;
          }
        }

        point = point->next;
      }

    } /* contours */


    /* now slightly increase the height of segments if this makes */
    /* sense -- this is used to better detect and ignore serifs   */
    {
      AF_Segment  segments     = axis->segments;
      AF_Segment  segments_end = FT_OFFSET( segments, axis->num_segments );


      for ( segment = segments; segment < segments_end; segment++ )
      {
        AF_Point  first   = segment->first;
        AF_Point  last    = segment->last;
        FT_Pos    first_v = first->v;
        FT_Pos    last_v  = last->v;


        if ( first_v < last_v )
        {
          AF_Point  p;


          p = first->prev;
          if ( p->v < first_v )
            segment->height = (FT_Short)( segment->height +
                                          ( ( first_v - p->v ) >> 1 ) );

          p = last->next;
          if ( p->v > last_v )
            segment->height = (FT_Short)( segment->height +
                                          ( ( p->v - last_v ) >> 1 ) );
        }
        else
        {
          AF_Point  p;


          p = first->prev;
          if ( p->v > first_v )
            segment->height = (FT_Short)( segment->height +
                                          ( ( p->v - first_v ) >> 1 ) );

          p = last->next;
          if ( p->v < last_v )
            segment->height = (FT_Short)( segment->height +
                                          ( ( last_v - p->v ) >> 1 ) );
        }
      }
    }

  Exit:
    return error;
  }